

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.h
# Opt level: O3

result_type *
jbcoin::sha512Half<unsigned_short>(result_type *__return_storage_ptr__,unsigned_short *args)

{
  sha512_half_hasher h;
  ushort local_f2;
  SHA512_CTX local_f0;
  
  SHA512_Init(&local_f0);
  local_f2 = *args << 8 | *args >> 8;
  SHA512_Update(&local_f0,&local_f2,2);
  detail::basic_sha512_half_hasher::operator_cast_to_base_uint
            (__return_storage_ptr__,(basic_sha512_half_hasher *)&local_f0);
  return __return_storage_ptr__;
}

Assistant:

sha512_half_hasher::result_type
sha512Half (Args const&... args)
{
    sha512_half_hasher h;
    using beast::hash_append;
    hash_append(h, args...);
    return static_cast<typename
        sha512_half_hasher::result_type>(h);
}